

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O2

void __thiscall SleighArchitecture::saveXmlHeader(SleighArchitecture *this,ostream *s)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"name",&local_31);
  a_v(s,&local_30,&this->filename);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"target",&local_31);
  a_v(s,&local_30,&this->target);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SleighArchitecture::saveXmlHeader(ostream &s) const

{
  a_v(s,"name",filename);
  a_v(s,"target",target);
}